

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTis.c
# Opt level: O2

void Gia_ManTisCollectMffc(Gia_Man_t *p,int Id,Vec_Int_t *vMffc,Vec_Int_t *vLeaves)

{
  int Id_00;
  Gia_Obj_t *pGVar1;
  
  pGVar1 = Gia_ManObj(p,Id);
  if ((-1 < (int)(uint)*(undefined8 *)pGVar1) &&
     (((uint)*(undefined8 *)pGVar1 & 0x1fffffff) != 0x1fffffff)) {
    vMffc->nSize = 0;
    vLeaves->nSize = 0;
    Gia_ManIncrementTravId(p);
    Gia_ManTisCollectMffc_rec(p,Id - (*(uint *)pGVar1 & 0x1fffffff),vMffc,vLeaves);
    Gia_ManTisCollectMffc_rec(p,Id - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vMffc,vLeaves);
    if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[Id] != 0)) {
      Id_00 = Gia_ObjFaninId2(p,Id);
      Gia_ManTisCollectMffc_rec(p,Id_00,vMffc,vLeaves);
    }
    Vec_IntPush(vMffc,Id);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTis.c"
                ,0x7e,"void Gia_ManTisCollectMffc(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManTisCollectMffc( Gia_Man_t * p, int Id, Vec_Int_t * vMffc, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Id );
    assert( Gia_ObjIsAnd(pObj) );
    Vec_IntClear( vMffc );
    Vec_IntClear( vLeaves );
    Gia_ManIncrementTravId( p );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId0(pObj, Id), vMffc, vLeaves );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId1(pObj, Id), vMffc, vLeaves );
    if ( Gia_ObjIsMuxId(p, Id) )
        Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId2(p, Id), vMffc, vLeaves );
    Vec_IntPush( vMffc, Id );
}